

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psstack.c
# Opt level: O0

void cf2_stack_pushFixed(CF2_Stack stack,CF2_F16Dot16 val)

{
  CF2_F16Dot16 val_local;
  CF2_Stack stack_local;
  
  if (stack->top == stack->buffer + stack->stackSize) {
    cf2_setError(stack->error,0x82);
  }
  else {
    (stack->top->u).r = val;
    stack->top->type = CF2_NumberFixed;
    stack->top = stack->top + 1;
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  cf2_stack_pushFixed( CF2_Stack  stack,
                       CF2_Fixed  val )
  {
    if ( stack->top == stack->buffer + stack->stackSize )
    {
      CF2_SET_ERROR( stack->error, Stack_Overflow );
      return;     /* stack overflow */
    }

    stack->top->u.r  = val;
    stack->top->type = CF2_NumberFixed;
    stack->top++;
  }